

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  Vdbe *in_RDI;
  sqlite3 *db;
  Vdbe *v;
  int rc;
  sqlite3 *in_stack_ffffffffffffffd8;
  sqlite3 *p;
  int local_c;
  
  if (in_RDI == (Vdbe *)0x0) {
    local_c = 0;
  }
  else {
    p = in_RDI->db;
    sqlite3_mutex_enter((sqlite3_mutex *)0x13a7bc);
    if (0 < in_RDI->startTime) {
      invokeProfileCallback(in_stack_ffffffffffffffd8,(Vdbe *)0x13a7da);
    }
    sqlite3VdbeReset((Vdbe *)p);
    sqlite3VdbeRewind(in_RDI);
    local_c = sqlite3ApiExit(in_stack_ffffffffffffffd8,0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x13a812);
  }
  return local_c;
}

Assistant:

SQLITE_API int sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    sqlite3_mutex_enter(db->mutex);
    checkProfileCallback(db, v);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (db->errMask))==rc );
    rc = sqlite3ApiExit(db, rc);
    sqlite3_mutex_leave(db->mutex);
  }
  return rc;
}